

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O1

btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_false>_>
* phmap::priv::
  btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_false>_>
  ::init_internal(btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_false>_>
                  *n,btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_false>_>
                     *parent)

{
  if (((ulong)n & 7) == 0) {
    *(btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_false>_>
      **)n = parent;
    *(undefined4 *)(n + 8) = 0;
    mutable_child(n,0);
    return n;
  }
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                ,0xf84,
                "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::map_params<std::pair<int, int>, std::pair<int, int>, phmap::Less<std::pair<int, int>>, std::allocator<std::pair<const std::pair<int, int>, std::pair<int, int>>>, 256, false>> *, unsigned char, phmap::priv::map_slot_type<std::pair<int, int>, std::pair<int, int>>, phmap::priv::btree_node<phmap::priv::map_params<std::pair<int, int>, std::pair<int, int>, phmap::Less<std::pair<int, int>>, std::allocator<std::pair<const std::pair<int, int>, std::pair<int, int>>>, 256, false>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::map_params<std::pair<int, int>, std::pair<int, int>, phmap::Less<std::pair<int, int>>, std::allocator<std::pair<const std::pair<int, int>, std::pair<int, int>>>, 256, false>> *, unsigned char, phmap::priv::map_slot_type<std::pair<int, int>, std::pair<int, int>>, phmap::priv::btree_node<phmap::priv::map_params<std::pair<int, int>, std::pair<int, int>, phmap::Less<std::pair<int, int>>, std::allocator<std::pair<const std::pair<int, int>, std::pair<int, int>>>, 256, false>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 0UL, Char = char]"
               );
}

Assistant:

static btree_node *init_internal(btree_node *n, btree_node *parent) {
            init_leaf(n, parent, kNodeValues);
            // Set `max_count` to a sentinel value to indicate that this node is
            // internal.
            n->set_max_count(kInternalNodeMaxCount);
            phmap::priv::SanitizerPoisonMemoryRegion(
                &n->mutable_child(0), (kNodeValues + 1) * sizeof(btree_node *));
            return n;
        }